

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perror.c
# Opt level: O2

void perror(char *__s)

{
  _PDCLIB_lc_messages_t *p_Var1;
  int *piVar2;
  char *pcVar3;
  FILE *__stream;
  
  mtx_lock(&stderr->mtx);
  if ((__s != (char *)0x0) && (*__s != '\n')) {
    fprintf((FILE *)stderr,"%s: ",__s);
  }
  piVar2 = _PDCLIB_errno_func();
  if (*piVar2 < 0x84) {
    piVar2 = _PDCLIB_errno_func();
    p_Var1 = _PDCLIB_lc_messages;
    __stream = (FILE *)stderr;
    if (-1 < *piVar2) {
      piVar2 = _PDCLIB_errno_func();
      pcVar3 = p_Var1->errno_texts[*piVar2];
      goto LAB_001032e3;
    }
  }
  pcVar3 = "unknown error";
  __stream = (FILE *)stderr;
LAB_001032e3:
  fprintf(__stream,"%s\n",pcVar3);
  mtx_unlock(&stderr->mtx);
  return;
}

Assistant:

void perror( const char * s )
{
    _PDCLIB_LOCK( stderr->mtx );

    if ( ( s != NULL ) && ( s[0] != '\n' ) )
    {
        fprintf( stderr, "%s: ", s );
    }

    if ( errno >= _PDCLIB_ERRNO_MAX || errno < 0 )
    {
        fprintf( stderr, "%s\n", _PDCLIB_EUNKNOWN_TEXT );
    }
    else
    {
        fprintf( stderr, "%s\n", _PDCLIB_lc_messages->errno_texts[errno] );
    }

    _PDCLIB_UNLOCK( stderr->mtx );
    return;
}